

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

void Abc_NtkComputeFanoutInfo(Abc_Obj_t *pObj,float Slew)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pNode;
  void *pvVar3;
  Abc_Ntk_t *pAVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  char *__function;
  long lVar9;
  char *__file;
  long lVar10;
  float fVar11;
  
  iVar6 = (pObj->vFanouts).nSize;
  if (0 < iVar6) {
    lVar10 = 0;
    do {
      pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar10]];
      uVar7 = *(uint *)&pNode->field_0x14 & 0xf;
      if (uVar7 == 7 && pNode->pNtk->ntkFunc == ABC_FUNC_MAP) {
        if (((pNode->vFanins).nSize == 1) && ((pNode->field_5).pData == (void *)0x0)) {
          iVar1 = pNode->Id;
          lVar8 = (long)iVar1;
          if (lVar8 < 0) {
LAB_003dee1c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          pvVar3 = pNode->pNtk->pBSMan;
          if (*(int *)(*(long *)((long)pvVar3 + 0x50) + 4) <= iVar1) goto LAB_003dee1c;
          if (iVar1 < *(int *)(*(long *)((long)pvVar3 + 0x40) + 4)) {
            *(undefined4 *)(*(long *)(*(long *)((long)pvVar3 + 0x40) + 8) + lVar8 * 4) =
                 *(undefined4 *)(*(long *)(*(long *)((long)pvVar3 + 0x50) + 8) + lVar8 * 4);
            if (*(int *)(*(long *)((long)pvVar3 + 0x48) + 4) <= iVar1) goto LAB_003dee1c;
            if (iVar1 < *(int *)(*(long *)((long)pvVar3 + 0x38) + 4)) {
              *(undefined4 *)(*(long *)(*(long *)((long)pvVar3 + 0x38) + 8) + lVar8 * 4) =
                   *(undefined4 *)(*(long *)(*(long *)((long)pvVar3 + 0x48) + 8) + lVar8 * 4);
              goto LAB_003dedab;
            }
          }
        }
        else {
LAB_003decd0:
          uVar7 = Abc_NodeFindFanin(pNode,pObj);
          fVar11 = Abc_NtkComputeEdgeDept((Abc_Obj_t *)pNode->pNtk,pNode->Id,Slew);
          iVar6 = pNode->Id;
          lVar8 = (long)iVar6;
          if (-1 < lVar8) {
            pAVar4 = pNode->pNtk;
            pvVar3 = pAVar4->pBSMan;
            lVar9 = *(long *)((long)pvVar3 + 0x40);
            if (iVar6 < *(int *)(lVar9 + 4)) {
              *(float *)(*(long *)(lVar9 + 8) + lVar8 * 4) = fVar11;
              if (pAVar4->vGates->nSize <= iVar6) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar2 = pAVar4->vGates->pArray[lVar8];
              if ((ulong)uVar2 == 0xffffffff) {
                lVar9 = 0;
LAB_003ded5e:
                if ((-1 < (int)uVar7) && ((int)uVar7 < *(int *)(lVar9 + 0x34))) {
                  lVar5 = *(long *)((long)pvVar3 + 0x38);
                  if (iVar6 < *(int *)(lVar5 + 4)) {
                    lVar9 = *(long *)(*(long *)(lVar9 + 0x38) + (ulong)uVar7 * 8);
                    *(float *)(*(long *)(lVar5 + 8) + lVar8 * 4) =
                         *(float *)(lVar9 + 0x10) * 0.5 + *(float *)(lVar9 + 0x14) * 0.5;
                    iVar6 = (pObj->vFanouts).nSize;
                    goto LAB_003dedab;
                  }
                  goto LAB_003dedc7;
                }
              }
              else if ((-1 < (int)uVar2) && ((int)uVar2 < *(int *)((long)pAVar4->pSCLib + 100))) {
                lVar9 = *(long *)(*(long *)((long)pAVar4->pSCLib + 0x68) + (ulong)uVar2 * 8);
                goto LAB_003ded5e;
              }
              __file = 
              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
              ;
              __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
              goto LAB_003dedf3;
            }
          }
        }
LAB_003dedc7:
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
        ;
        __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
LAB_003dedf3:
        __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
      }
      if (uVar7 - 5 < 0xfffffffe) goto LAB_003decd0;
LAB_003dedab:
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar6);
  }
  return;
}

Assistant:

void Abc_NtkComputeFanoutInfo( Abc_Obj_t * pObj, float Slew )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Abc_ObjIsBarBuf(pFanout) )
        {
            Bus_SclObjSetETime( pFanout, Bus_SclObjDept(pFanout) );
            Bus_SclObjSetCin( pFanout, Bus_SclObjLoad(pFanout) );
        }
        else if ( !Abc_ObjIsCo(pFanout) )
        {
            int iFanin = Abc_NodeFindFanin(pFanout, pObj);
            Bus_SclObjSetETime( pFanout, Abc_NtkComputeEdgeDept(pFanout, iFanin, Slew) );
            Bus_SclObjSetCin( pFanout, SC_CellPinCap( Abc_SclObjCell(pFanout), iFanin ) );
        }
    }
}